

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O0

void Sim_SymmsAppendFromGroup
               (Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodesPi,Vec_Ptr_t *vNodesOther,Vec_Int_t *vSymms,
               int *pMap)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_4c;
  int local_48;
  int k;
  int i;
  uint uSymm;
  Abc_Obj_t *pNode2;
  Abc_Obj_t *pNode1;
  int *pMap_local;
  Vec_Int_t *vSymms_local;
  Vec_Ptr_t *vNodesOther_local;
  Vec_Ptr_t *vNodesPi_local;
  Abc_Ntk_t *pNtk_local;
  
  if (vNodesPi->nSize != 0) {
    for (local_48 = 0; local_4c = local_48, local_48 < vNodesPi->nSize; local_48 = local_48 + 1) {
      while (local_4c = local_4c + 1, local_4c < vNodesPi->nSize) {
        pAVar2 = Abc_ObjRegular((Abc_Obj_t *)vNodesPi->pArray[local_48]);
        pAVar3 = Abc_ObjRegular((Abc_Obj_t *)vNodesPi->pArray[local_4c]);
        if (pMap[pAVar2->Id] == pMap[pAVar3->Id]) {
          __assert_fail("pMap[pNode1->Id] != pMap[pNode2->Id]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simSymStr.c"
                        ,0xf0,
                        "void Sim_SymmsAppendFromGroup(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, int *)"
                       );
        }
        if (pMap[pAVar2->Id] < 0) {
          __assert_fail("pMap[pNode1->Id] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simSymStr.c"
                        ,0xf1,
                        "void Sim_SymmsAppendFromGroup(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, int *)"
                       );
        }
        if (pMap[pAVar3->Id] < 0) {
          __assert_fail("pMap[pNode2->Id] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simSymStr.c"
                        ,0xf2,
                        "void Sim_SymmsAppendFromGroup(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, int *)"
                       );
        }
        if (pMap[pAVar2->Id] < pMap[pAVar3->Id]) {
          k = pMap[pAVar2->Id] << 0x10 | pMap[pAVar3->Id];
        }
        else {
          k = pMap[pAVar3->Id] << 0x10 | pMap[pAVar2->Id];
        }
        iVar1 = Sim_SymmsIsCompatibleWithNodes(pNtk,k,vNodesOther,pMap);
        if (iVar1 != 0) {
          Vec_IntPushUnique(vSymms,k);
        }
      }
    }
  }
  return;
}

Assistant:

void Sim_SymmsAppendFromGroup( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodesPi, Vec_Ptr_t * vNodesOther, Vec_Int_t * vSymms, int * pMap )
{
    Abc_Obj_t * pNode1, * pNode2;
    unsigned uSymm;
    int i, k;

    if ( vNodesPi->nSize == 0 )
        return;

    // go through the pairs
    for ( i = 0; i < vNodesPi->nSize; i++ )
    for ( k = i+1; k < vNodesPi->nSize; k++ )
    {
        // get the two PI nodes
        pNode1 = Abc_ObjRegular((Abc_Obj_t *)vNodesPi->pArray[i]);
        pNode2 = Abc_ObjRegular((Abc_Obj_t *)vNodesPi->pArray[k]);
        assert( pMap[pNode1->Id] != pMap[pNode2->Id] );
        assert( pMap[pNode1->Id] >= 0 );
        assert( pMap[pNode2->Id] >= 0 );
        // generate symmetry
        if ( pMap[pNode1->Id] < pMap[pNode2->Id] )
            uSymm = ((pMap[pNode1->Id] << 16) | pMap[pNode2->Id]);
        else
            uSymm = ((pMap[pNode2->Id] << 16) | pMap[pNode1->Id]);
        // check if symmetry belongs
        if ( Sim_SymmsIsCompatibleWithNodes( pNtk, uSymm, vNodesOther, pMap ) )
            Vec_IntPushUnique( vSymms, (int)uSymm );
    }
}